

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O1

void vera::splitFacesFromHorizontalRow<float>
               (float *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<float> **_faces)

{
  CubemapFace<float> *pCVar1;
  float *pfVar2;
  size_t sVar3;
  ulong uVar4;
  int iFace;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  uVar7 = _width / 6;
  iVar6 = (int)uVar7;
  lVar8 = ((ulong)(uint)(iVar6 * (int)_height) << 0x20) * 3;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar8) {
    uVar4 = lVar8 >> 0x1e;
  }
  lVar8 = 0;
  do {
    pCVar1 = (CubemapFace<float> *)operator_new(0x18);
    pCVar1->id = 0;
    pCVar1->width = 0;
    pCVar1->height = 0;
    pCVar1->currentOffset = 0;
    pCVar1->data = (float *)0x0;
    _faces[lVar8] = pCVar1;
    pCVar1->id = (int)lVar8;
    pfVar2 = (float *)operator_new__(uVar4);
    pCVar1->data = pfVar2;
    pCVar1->width = iVar6;
    pCVar1->height = (int)_height;
    pCVar1->currentOffset = 0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  if (_height != 0) {
    lVar8 = 0;
    sVar3 = 0;
    do {
      lVar5 = 0;
      lVar9 = lVar8;
      do {
        pCVar1 = _faces[lVar5];
        if (pCVar1 != (CubemapFace<float> *)0x0) {
          memcpy(pCVar1->data + pCVar1->currentOffset,(void *)((lVar9 >> 0x1e) + (long)_data),
                 (long)((uVar7 << 0x22) * 3) >> 0x20);
          pCVar1->currentOffset = pCVar1->currentOffset + iVar6 * 3;
        }
        lVar5 = lVar5 + 1;
        lVar9 = lVar9 + uVar7 * 0x300000000;
      } while (lVar5 != 6);
      sVar3 = sVar3 + 1;
      lVar8 = lVar8 + _width * 0x300000000;
    } while (sVar3 != _height);
  }
  return;
}

Assistant:

void splitFacesFromHorizontalRow(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width / 6;
    int faceHeight = _height;

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        // int jFace = (l - (l % faceHeight)) / faceHeight;
        for (int iFace = 0; iFace < 6; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = 3 * (faceWidth * iFace + l * _width);

            //   0   1   2   3   4   5 i      
            //  +X  -X  +Y  -Y  +Z  -Z 
            //
            face = _faces[iFace];

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * 3;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (3 * faceWidth);
            }
        }
    }
}